

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O1

char * vstrdupf(char *fmt,__va_list_tag *args)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  char *pcVar7;
  char *pcVar8;
  va_list args2;
  __va_list_tag _Stack_140;
  undefined1 auStack_120 [8];
  undefined8 uStack_118;
  undefined1 *puStack_108;
  __va_list_tag *p_Stack_68;
  undefined8 local_38;
  void *pvStack_30;
  void *local_28;
  
  puVar5 = &local_38;
  local_28 = args->reg_save_area;
  local_38._0_4_ = args->gp_offset;
  local_38._4_4_ = args->fp_offset;
  pvStack_30 = args->overflow_arg_area;
  pcVar8 = "";
  if (fmt != (char *)0x0) {
    pcVar8 = fmt;
  }
  uVar6 = 0;
  iVar3 = vsnprintf((char *)0x0,0,pcVar8,&local_38);
  pcVar7 = (char *)(long)(iVar3 + 2);
  pcVar4 = (char *)malloc((size_t)pcVar7);
  if (pcVar4 != (char *)0x0) {
    vsprintf(pcVar4,pcVar8,args);
    return pcVar4;
  }
  vstrdupf_cold_1();
  _Stack_140.reg_save_area = auStack_120;
  _Stack_140.overflow_arg_area = &pvStack_30;
  _Stack_140.gp_offset = 8;
  _Stack_140.fp_offset = 0x30;
  if (pcVar7 != (char *)0x0) {
    uStack_118 = uVar6;
    puStack_108 = (undefined1 *)puVar5;
    p_Stack_68 = args;
    pcVar7 = vstrdupf(pcVar7,&_Stack_140);
    cVar1 = *pcVar7;
    pcVar8 = pcVar7;
    pcVar4 = pcVar7;
    while (cVar1 != '\0') {
      cVar1 = *pcVar8;
      bVar2 = true;
      if ((cVar1 == '\n') || (cVar1 == '\0')) {
        *pcVar8 = '\0';
        bVar2 = false;
        printf("# %s\n",pcVar4);
        if (cVar1 != '\0') {
          *pcVar8 = cVar1;
          bVar2 = true;
          pcVar4 = pcVar8 + 1;
        }
      }
      if (!bVar2) break;
      pcVar8 = pcVar8 + 1;
      cVar1 = *pcVar4;
    }
    free(pcVar7);
  }
  return (char *)0x0;
}

Assistant:

static char *
vstrdupf (const char *fmt, va_list args) {
    char *str;
    int size;
    va_list args2;
    va_copy(args2, args);
    if (!fmt)
        fmt = "";
    size = vsnprintf(NULL, 0, fmt, args2) + 2;
    str = malloc(size);
    if (!str) {
        perror("malloc error");
        exit(1);
    }
    vsprintf(str, fmt, args);
    va_end(args2);
    return str;
}